

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::Property<Protocol::MQTT::Common::VBInt>::readFrom
          (Property<Protocol::MQTT::Common::VBInt> *this,uint8 *buffer,uint32 bufLength)

{
  bool bVar1;
  uint32 o;
  uint32 bufLength_local;
  uint8 *buffer_local;
  Property<Protocol::MQTT::Common::VBInt> *this_local;
  
  if (((*buffer & 0x80) == 0) && (*buffer == (this->super_PropertyBase).type)) {
    if (bufLength < 2) {
      this_local._4_4_ = 0xfffffffe;
    }
    else {
      this_local._4_4_ = Common::VBInt::readFrom(&this->value,buffer + 1,bufLength - 1);
      bVar1 = Common::isError(this_local._4_4_);
      if (!bVar1) {
        this_local._4_4_ = this_local._4_4_ + 1;
      }
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    if ((buffer[0] & 0x80) || buffer[0] != type) return BadData;
                    if (bufLength < 2) return NotEnoughData;
                    uint32 o = value.readFrom(buffer+1, bufLength - 1);
                    if (isError(o)) return o;
                    return o+1;
                }